

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator_icu.cpp
# Opt level: O0

int __thiscall QCollator::compare(QCollator *this,QStringView s1,QStringView s2)

{
  QStringView rhs;
  QStringView lhs;
  qsizetype qVar1;
  const_pointer pvVar2;
  ulong uVar3;
  const_pointer pvVar4;
  ulong uVar5;
  CaseSensitivity in_ECX;
  storage_type_conflict *in_RDX;
  storage_type_conflict *in_RSI;
  long *in_RDI;
  storage_type_conflict *in_R8;
  long in_FS_OFFSET;
  QCollatorPrivate *in_stack_ffffffffffffff80;
  undefined8 uVar6;
  int local_4c;
  storage_type_conflict *psVar7;
  
  psVar7 = *(storage_type_conflict **)(in_FS_OFFSET + 0x28);
  qVar1 = QStringView::size((QStringView *)&stack0xffffffffffffffe8);
  if (qVar1 == 0) {
    qVar1 = QStringView::size((QStringView *)&stack0xffffffffffffffd8);
    local_4c = 0;
    if (qVar1 != 0) {
      local_4c = -1;
    }
  }
  else {
    qVar1 = QStringView::size((QStringView *)&stack0xffffffffffffffd8);
    if (qVar1 == 0) {
      local_4c = 1;
    }
    else {
      QCollatorPrivate::ensureInitialized(in_stack_ffffffffffffff80);
      if (*(long *)(*in_RDI + 0x18) == 0) {
        lhs.m_data = psVar7;
        lhs.m_size = (qsizetype)in_RDX;
        rhs.m_data = in_RSI;
        rhs.m_size = (qsizetype)in_R8;
        local_4c = QtPrivate::compareStrings(lhs,rhs,in_ECX);
      }
      else {
        uVar6 = *(undefined8 *)(*in_RDI + 0x18);
        pvVar2 = QStringView::data((QStringView *)&stack0xffffffffffffffe8);
        uVar3 = QStringView::size((QStringView *)&stack0xffffffffffffffe8);
        pvVar4 = QStringView::data((QStringView *)&stack0xffffffffffffffd8);
        uVar5 = QStringView::size((QStringView *)&stack0xffffffffffffffd8);
        local_4c = ucol_strcoll_70(uVar6,pvVar2,uVar3 & 0xffffffff,pvVar4,uVar5 & 0xffffffff);
      }
    }
  }
  if (*(storage_type_conflict **)(in_FS_OFFSET + 0x28) != psVar7) {
    __stack_chk_fail();
  }
  return local_4c;
}

Assistant:

int QCollator::compare(QStringView s1, QStringView s2) const
{
    if (!s1.size())
        return s2.size() ? -1 : 0;
    if (!s2.size())
        return +1;

    d->ensureInitialized();

    if (d->collator) {
        // truncating sizes (QTBUG-105038)
        return ucol_strcoll(d->collator,
                            reinterpret_cast<const UChar *>(s1.data()), s1.size(),
                            reinterpret_cast<const UChar *>(s2.data()), s2.size());
    }

    return QtPrivate::compareStrings(s1, s2, d->caseSensitivity);
}